

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enter.hpp
# Opt level: O3

void __thiscall
soplex::
SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::computeDualfarkas4Row
          (SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *this,number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *direction,SPxId enterId)

{
  DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *this_00;
  uint *puVar1;
  pointer pnVar2;
  undefined8 uVar3;
  int iVar4;
  int i;
  UpdateVector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pUVar5;
  long lVar6;
  uint uVar7;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  sign;
  SPxId spxid;
  cpp_dec_float<50U,_int,_void> local_108;
  cpp_dec_float<50U,_int,_void> local_c8;
  DataKey local_90;
  DataKey local_88;
  DataKey local_80;
  undefined1 local_78 [16];
  uint local_68 [2];
  uint auStack_60 [2];
  uint local_58 [2];
  int local_50;
  bool local_4c;
  undefined8 local_48;
  DataKey local_38;
  
  uVar7 = 0x3ff00000;
  local_90 = enterId.super_DataKey;
  local_80 = enterId.super_DataKey;
  if ((direction->m_backend).fpclass != cpp_dec_float_NaN) {
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<long_long>
              (&local_c8,0,(type *)0x0);
    iVar4 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                      (&direction->m_backend,&local_c8);
    uVar7 = 0x3ff00000;
    if (0 < iVar4) {
      uVar7 = 0xbff00000;
    }
  }
  local_c8.fpclass = cpp_dec_float_finite;
  local_c8.prec_elem = 10;
  local_c8.data._M_elems[0] = 0;
  local_c8.data._M_elems[1] = 0;
  local_c8.data._M_elems[2] = 0;
  local_c8.data._M_elems[3] = 0;
  local_c8.data._M_elems[4] = 0;
  local_c8.data._M_elems[5] = 0;
  local_c8.data._M_elems._24_5_ = 0;
  local_c8.data._M_elems[7]._1_3_ = 0;
  local_c8.data._M_elems._32_5_ = 0;
  local_c8.data._M_elems[9]._1_3_ = 0;
  local_c8.exp = 0;
  local_c8.neg = false;
  boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
            ((cpp_dec_float<50u,int,void> *)&local_c8,(double)((ulong)uVar7 << 0x20));
  this_00 = &this->dualFarkas;
  (this->dualFarkas).
  super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  .memused = 0;
  DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::setMax(this_00,(this->theFvec->thedelta).super_IdxSet.num + 1);
  pUVar5 = this->theFvec;
  if (0 < (pUVar5->thedelta).super_IdxSet.num) {
    lVar6 = 0;
    do {
      local_88 = (this->
                 super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).theBaseId.data[(pUVar5->thedelta).super_IdxSet.idx[lVar6]].super_DataKey;
      if (local_88.info < 0) {
        SPxRowId::SPxRowId((SPxRowId *)&local_38,(SPxId *)&local_88);
        i = ClassSet<soplex::SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::DLPSV>
            ::number(&(this->
                      super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      ).
                      super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      .
                      super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      .set,&local_38);
        pnVar2 = (this->theFvec->thedelta).
                 super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 .val.
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        iVar4 = (this->theFvec->thedelta).super_IdxSet.idx[lVar6];
        local_58 = *(uint (*) [2])((long)&pnVar2[iVar4].m_backend.data + 0x20);
        local_78._0_8_ = *(DataKey *)(pnVar2 + iVar4);
        local_78._8_8_ = ((DataKey *)(pnVar2 + iVar4))[1];
        puVar1 = (uint *)((long)&pnVar2[iVar4].m_backend.data + 0x10);
        local_68 = *(uint (*) [2])puVar1;
        auStack_60 = *(uint (*) [2])(puVar1 + 2);
        local_50 = pnVar2[iVar4].m_backend.exp;
        local_4c = pnVar2[iVar4].m_backend.neg;
        local_48._0_4_ = pnVar2[iVar4].m_backend.fpclass;
        local_48._4_4_ = pnVar2[iVar4].m_backend.prec_elem;
        local_108.data._M_elems[7]._1_3_ = local_c8.data._M_elems[7]._1_3_;
        local_108.data._M_elems._24_5_ = local_c8.data._M_elems._24_5_;
        local_108.data._M_elems[0] = local_c8.data._M_elems[0];
        local_108.data._M_elems[1] = local_c8.data._M_elems[1];
        local_108.data._M_elems[2] = local_c8.data._M_elems[2];
        local_108.data._M_elems[3] = local_c8.data._M_elems[3];
        local_108.data._M_elems[4] = local_c8.data._M_elems[4];
        local_108.data._M_elems[5] = local_c8.data._M_elems[5];
        local_108.data._M_elems[9]._1_3_ = local_c8.data._M_elems[9]._1_3_;
        local_108.data._M_elems._32_5_ = local_c8.data._M_elems._32_5_;
        local_108.exp = local_c8.exp;
        local_108.neg = local_c8.neg;
        local_108.fpclass = local_c8.fpclass;
        local_108.prec_elem = local_c8.prec_elem;
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator*=
                  (&local_108,(cpp_dec_float<50U,_int,_void> *)local_78);
        DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ::add(this_00,i,
              (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *)&local_108);
        pUVar5 = this->theFvec;
      }
      lVar6 = lVar6 + 1;
    } while (lVar6 < (pUVar5->thedelta).super_IdxSet.num);
  }
  if (local_90.info < 0) {
    SPxRowId::SPxRowId((SPxRowId *)local_78,(SPxId *)&local_80);
    iVar4 = ClassSet<soplex::SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::DLPSV>
            ::number(&(this->
                      super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      ).
                      super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      .
                      super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      .set,(DataKey *)local_78);
    local_108.data._M_elems[7]._1_3_ = local_c8.data._M_elems[7]._1_3_;
    local_108.data._M_elems._24_5_ = local_c8.data._M_elems._24_5_;
    local_108.data._M_elems[0] = local_c8.data._M_elems[0];
    local_108.data._M_elems[1] = local_c8.data._M_elems[1];
    uVar3 = local_108.data._M_elems._0_8_;
    local_108.data._M_elems[2] = local_c8.data._M_elems[2];
    local_108.data._M_elems[3] = local_c8.data._M_elems[3];
    local_108.data._M_elems[9]._1_3_ = local_c8.data._M_elems[9]._1_3_;
    local_108.data._M_elems._32_5_ = local_c8.data._M_elems._32_5_;
    local_108.data._M_elems[4] = local_c8.data._M_elems[4];
    local_108.data._M_elems[5] = local_c8.data._M_elems[5];
    local_108.exp = local_c8.exp;
    local_108.neg = local_c8.neg;
    local_108.fpclass = local_c8.fpclass;
    local_108.prec_elem = local_c8.prec_elem;
    local_108.data._M_elems[0] = local_c8.data._M_elems[0];
    if (local_c8.fpclass != cpp_dec_float_finite || local_108.data._M_elems[0] != 0) {
      local_108.neg = (bool)(local_c8.neg ^ 1);
    }
    local_108.data._M_elems._0_8_ = uVar3;
    DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::add(this_00,iVar4,
          (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
           *)&local_108);
  }
  return;
}

Assistant:

void SPxSolverBase<R>::computeDualfarkas4Row(R direction, SPxId enterId)
{
   R sign = (direction > 0 ? -1.0 : 1.0);

   dualFarkas.clear();
   dualFarkas.setMax(fVec().delta().size() + 1);

   for(int j = 0; j < fVec().delta().size(); ++j)
   {
      SPxId spxid = this->baseId(fVec().idx().index(j));

      if(spxid.isSPxRowId())
         dualFarkas.add(this->number(SPxRowId(spxid)), sign * fVec().delta().value(j));
   }

   if(enterId.isSPxRowId())
      dualFarkas.add(this->number(SPxRowId(enterId)), -sign);
}